

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::
InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::clear(InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this)

{
  long *plVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long *plVar4;
  ulong uVar5;
  long lVar6;
  
  uVar2 = this->nStored;
  if (uVar2 != 0) {
    lVar6 = 0x10;
    uVar5 = 0;
    do {
      pbVar3 = this->ptr;
      if (this->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->field_2
        ;
      }
      plVar1 = *(long **)((long)pbVar3 + lVar6 + -0x10);
      plVar4 = (long *)((long)&pbVar3->_M_dataplus + lVar6);
      if (plVar4 != plVar1) {
        operator_delete(plVar1,*plVar4 + 1);
        uVar2 = this->nStored;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar5 < uVar2);
  }
  this->nStored = 0;
  return;
}

Assistant:

void clear() {
        for (int i = 0; i < nStored; ++i)
            alloc.destroy(begin() + i);
        nStored = 0;
    }